

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_tri_fitness(REF_NODE ref_node,REF_INT *nodes,REF_DBL *fitness)

{
  int iVar1;
  int iVar2;
  int iVar3;
  REF_DBL *pRVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  undefined8 uVar8;
  long lVar9;
  ulong uVar10;
  double dVar11;
  bool bVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  REF_DBL e20 [3];
  REF_DBL r13 [3];
  REF_DBL r12 [3];
  REF_DBL rhy [3];
  REF_DBL e12 [3];
  REF_DBL e01 [3];
  double local_d8 [4];
  double local_b8 [4];
  double local_98 [4];
  double local_78;
  undefined8 uStack_70;
  double local_68 [4];
  double local_48 [4];
  double local_28 [4];
  
  *fitness = -1.0;
  pRVar4 = ref_node->real;
  iVar1 = nodes[1];
  iVar2 = *nodes;
  iVar3 = nodes[2];
  lVar9 = 0;
  do {
    dVar11 = *(double *)((long)pRVar4 + lVar9 + (long)iVar1 * 0x78);
    dVar13 = *(double *)((long)pRVar4 + lVar9 + (long)iVar2 * 0x78);
    *(double *)((long)local_28 + lVar9) = dVar11 - dVar13;
    dVar14 = *(double *)((long)pRVar4 + lVar9 + (long)iVar3 * 0x78);
    *(double *)((long)local_48 + lVar9) = dVar14 - dVar11;
    *(double *)((long)local_d8 + lVar9) = dVar13 - dVar14;
    lVar9 = lVar9 + 8;
  } while (lVar9 != 0x18);
  dVar11 = local_48[2] * local_48[2] + local_48[0] * local_48[0] + local_48[1] * local_48[1];
  dVar13 = local_28[2] * local_28[2] + local_28[0] * local_28[0] + local_28[1] * local_28[1];
  uVar5 = 0;
  uVar6 = 0;
  if ((dVar13 <= dVar11) &&
     (uVar6 = 0,
     local_d8[2] * local_d8[2] + local_d8[0] * local_d8[0] + local_d8[1] * local_d8[1] <= dVar11)) {
    uVar6 = 1;
  }
  dVar14 = local_d8[2] * local_d8[2] + local_d8[0] * local_d8[0] + local_d8[1] * local_d8[1];
  bVar12 = dVar13 <= dVar14 && dVar11 <= dVar14;
  uVar7 = (ulong)uVar6;
  if (bVar12) {
    uVar7 = 2;
  }
  uVar10 = (ulong)(uVar6 + 1);
  if (bVar12) {
    uVar10 = uVar5;
  }
  uVar6 = (int)uVar7 - 1;
  if ((int)uVar7 == 0) {
    uVar6 = 2;
  }
  pRVar4 = ref_node->real;
  iVar1 = nodes[uVar10];
  iVar2 = nodes[uVar7];
  iVar3 = nodes[uVar6];
  do {
    dVar11 = pRVar4[(long)iVar2 * 0xf + uVar5];
    local_98[uVar5] = pRVar4[(long)iVar1 * 0xf + uVar5] - dVar11;
    local_b8[uVar5] = pRVar4[(long)iVar3 * 0xf + uVar5] - dVar11;
    uVar5 = uVar5 + 1;
  } while (uVar5 != 3);
  dVar11 = local_98[2] * local_98[2] + local_98[0] * local_98[0] + local_98[1] * local_98[1];
  dVar13 = dVar11 * 1e+20;
  if (dVar13 <= -dVar13) {
    dVar13 = -dVar13;
  }
  dVar15 = local_98[2] * local_b8[2] + local_98[0] * local_b8[0] + local_98[1] * local_b8[1];
  dVar14 = dVar15;
  if (dVar15 <= -dVar15) {
    dVar14 = -dVar15;
  }
  if (dVar13 <= dVar14) {
    uVar8 = 0x9a5;
  }
  else {
    local_78 = dVar15 / dVar11;
    uStack_70 = 0;
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    lVar9 = 0;
    do {
      local_68[lVar9] = local_98[lVar9] * -local_78 + local_b8[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    dVar13 = local_68[2] * local_68[2] + local_68[0] * local_68[0] + local_68[1] * local_68[1];
    if (dVar13 < 0.0) {
      local_d8[3] = dVar11;
      dVar13 = sqrt(dVar13);
      dVar11 = local_d8[3];
    }
    else {
      dVar13 = SQRT(dVar13);
    }
    dVar14 = (local_78 - local_78 * local_78) * dVar11 * 0.5;
    dVar11 = dVar13 * 1e+20;
    if (dVar11 <= -dVar11) {
      dVar11 = -dVar11;
    }
    dVar15 = dVar14;
    if (dVar14 <= -dVar14) {
      dVar15 = -dVar14;
    }
    if (dVar15 < dVar11) {
      *fitness = dVar14 / dVar13;
      return 0;
    }
    uVar8 = 0x9b1;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar8,
         "ref_node_tri_fitness",4,"divide by longest edge");
  return 4;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_fitness(REF_NODE ref_node, REF_INT *nodes,
                                        REF_DBL *fitness) {
  REF_DBL e01[3], e12[3], e20[3], r12[3], r13[3], rhy[3];
  REF_INT i, node0, node1, node2;
  REF_DBL s, num, hx, hy;

  *fitness = -1.0;

  node0 = 0;
  node1 = 1;
  node2 = 2;
  for (i = 0; i < 3; i++) {
    e01[i] = ref_node_xyz(ref_node, i, nodes[node1]) -
             ref_node_xyz(ref_node, i, nodes[node0]);
    e12[i] = ref_node_xyz(ref_node, i, nodes[node2]) -
             ref_node_xyz(ref_node, i, nodes[node1]);
    e20[i] = ref_node_xyz(ref_node, i, nodes[node0]) -
             ref_node_xyz(ref_node, i, nodes[node2]);
  }
  node0 = 0;
  if (ref_math_dot(e12, e12) >= ref_math_dot(e01, e01) &&
      ref_math_dot(e12, e12) >= ref_math_dot(e20, e20))
    node0 = 1;
  if (ref_math_dot(e20, e20) >= ref_math_dot(e01, e01) &&
      ref_math_dot(e20, e20) >= ref_math_dot(e12, e12))
    node0 = 2;
  node1 = node0 + 1;
  node2 = node0 + 2;
  if (node1 > 2) node1 -= 3;
  if (node2 > 2) node2 -= 3;

  for (i = 0; i < 3; i++) {
    r12[i] = ref_node_xyz(ref_node, i, nodes[node1]) -
             ref_node_xyz(ref_node, i, nodes[node0]);
    r13[i] = ref_node_xyz(ref_node, i, nodes[node2]) -
             ref_node_xyz(ref_node, i, nodes[node0]);
  }
  if (ref_math_divisible(ref_math_dot(r12, r13), ref_math_dot(r12, r12))) {
    s = ref_math_dot(r12, r13) / ref_math_dot(r12, r12);
  } else {
    s = 0.0;
    RSS(REF_DIV_ZERO, "divide by longest edge");
  }
  hx = sqrt(ref_math_dot(r12, r12));
  for (i = 0; i < 3; i++) {
    rhy[i] = (r13[i] - s * r12[i]);
  }
  hy = sqrt(ref_math_dot(rhy, rhy));

  num = 0.5 * hx * (s - s * s);
  if (ref_math_divisible(num, hy)) {
    *fitness = num / hy;
  } else {
    RSS(REF_DIV_ZERO, "divide by longest edge");
  }

  return REF_SUCCESS;
}